

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O2

void FAudioFXVolumeMeter_Process
               (FAudioFXVolumeMeter *fapo,uint32_t InputProcessParameterCount,
               FAPOProcessBufferParameters *pInputProcessParameters,
               uint32_t OutputProcessParameterCount,
               FAPOProcessBufferParameters *pOutputProcessParameters,int32_t IsEnabled)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  ulong uVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  float fVar9;
  
  plVar2 = (long *)FAPOBase_BeginProcess(&fapo->base);
  for (uVar4 = 0; uVar4 < fapo->channels; uVar4 = uVar4 + 1) {
    pfVar5 = (float *)(uVar4 * 4 + (long)pInputProcessParameters->pBuffer);
    fVar9 = 0.0;
    fVar6 = 0.0;
    for (uVar3 = 0; uVar1 = pInputProcessParameters->ValidFrameCount, uVar3 < uVar1;
        uVar3 = uVar3 + 1) {
      fVar7 = (float)SDL_fabsf(*pfVar5);
      if (fVar7 <= fVar6) {
        fVar7 = fVar6;
      }
      fVar9 = fVar9 + *pfVar5 * *pfVar5;
      pfVar5 = pfVar5 + fapo->channels;
      fVar6 = fVar7;
    }
    *(float *)(*plVar2 + uVar4 * 4) = fVar6;
    uVar8 = SDL_sqrtf(fVar9 / (float)uVar1);
    *(undefined4 *)(plVar2[1] + uVar4 * 4) = uVar8;
  }
  FAPOBase_EndProcess(&fapo->base);
  return;
}

Assistant:

void FAudioFXVolumeMeter_Process(
	FAudioFXVolumeMeter *fapo,
	uint32_t InputProcessParameterCount,
	const FAPOProcessBufferParameters* pInputProcessParameters,
	uint32_t OutputProcessParameterCount,
	FAPOProcessBufferParameters* pOutputProcessParameters,
	int32_t IsEnabled
) {
	float peak;
	float total;
	float *buffer;
	uint32_t i, j;
	FAudioFXVolumeMeterLevels *levels = (FAudioFXVolumeMeterLevels*)
		FAPOBase_BeginProcess(&fapo->base);

	/* TODO: This could probably be SIMD-ified... */
	for (i = 0; i < fapo->channels; i += 1)
	{
		peak = 0.0f;
		total = 0.0f;
		buffer = ((float*) pInputProcessParameters->pBuffer) + i;
		for (j = 0; j < pInputProcessParameters->ValidFrameCount; j += 1, buffer += fapo->channels)
		{
			const float sampleAbs = FAudio_fabsf(*buffer);
			if (sampleAbs > peak)
			{
				peak = sampleAbs;
			}
			total += (*buffer) * (*buffer);
		}
		levels->pPeakLevels[i] = peak;
		levels->pRMSLevels[i] = FAudio_sqrtf(
			total / pInputProcessParameters->ValidFrameCount
		);
	}

	FAPOBase_EndProcess(&fapo->base);
}